

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dead_branch_elim_pass.cpp
# Opt level: O0

void __thiscall
spvtools::opt::DeadBranchElimPass::MarkUnreachableStructuredTargets
          (DeadBranchElimPass *this,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *live_blocks,
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          *unreachable_merges,
          unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
          *unreachable_continues)

{
  BasicBlock *pBVar1;
  bool bVar2;
  reference ppBVar3;
  size_type sVar4;
  mapped_type *ppBVar5;
  pair<std::__detail::_Node_iterator<spvtools::opt::BasicBlock_*,_true,_false>,_bool> pVar6;
  BasicBlock *local_78;
  BasicBlock *cont_block;
  _Node_iterator_base<spvtools::opt::BasicBlock_*,_false> _Stack_68;
  uint32_t cont_id;
  undefined1 local_60;
  BasicBlock *local_58;
  BasicBlock *merge_block;
  BasicBlock *pBStack_48;
  uint32_t merge_id;
  value_type block;
  const_iterator __end2;
  const_iterator __begin2;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *__range2;
  unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
  *unreachable_continues_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *unreachable_merges_local;
  unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
  *live_blocks_local;
  DeadBranchElimPass *this_local;
  
  __end2 = std::
           unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
           ::begin(live_blocks);
  block = (value_type)
          std::
          unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
          ::end(live_blocks);
  while (bVar2 = std::__detail::operator!=
                           (&__end2.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>,
                            (_Node_iterator_base<spvtools::opt::BasicBlock_*,_false> *)&block),
        bVar2) {
    ppBVar3 = std::__detail::_Node_const_iterator<spvtools::opt::BasicBlock_*,_true,_false>::
              operator*(&__end2);
    pBStack_48 = *ppBVar3;
    merge_block._4_4_ = BasicBlock::MergeBlockIdIfAny(pBStack_48);
    if (merge_block._4_4_ != 0) {
      local_58 = GetParentBlock(this,merge_block._4_4_);
      sVar4 = std::
              unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
              ::count(live_blocks,&local_58);
      if (sVar4 == 0) {
        pVar6 = std::
                unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ::insert(unreachable_merges,&local_58);
        _Stack_68._M_cur =
             (__node_type *)
             pVar6.first.super__Node_iterator_base<spvtools::opt::BasicBlock_*,_false>._M_cur;
        local_60 = pVar6.second;
      }
      cont_block._4_4_ = BasicBlock::ContinueBlockIdIfAny(pBStack_48);
      if (cont_block._4_4_ != 0) {
        local_78 = GetParentBlock(this,cont_block._4_4_);
        sVar4 = std::
                unordered_set<spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<spvtools::opt::BasicBlock_*>_>
                ::count(live_blocks,&local_78);
        pBVar1 = pBStack_48;
        if (sVar4 == 0) {
          ppBVar5 = std::
                    unordered_map<spvtools::opt::BasicBlock_*,_spvtools::opt::BasicBlock_*,_std::hash<spvtools::opt::BasicBlock_*>,_std::equal_to<spvtools::opt::BasicBlock_*>,_std::allocator<std::pair<spvtools::opt::BasicBlock_*const,_spvtools::opt::BasicBlock_*>_>_>
                    ::operator[](unreachable_continues,&local_78);
          *ppBVar5 = pBVar1;
        }
      }
    }
    std::__detail::_Node_const_iterator<spvtools::opt::BasicBlock_*,_true,_false>::operator++
              (&__end2);
  }
  return;
}

Assistant:

void DeadBranchElimPass::MarkUnreachableStructuredTargets(
    const std::unordered_set<BasicBlock*>& live_blocks,
    std::unordered_set<BasicBlock*>* unreachable_merges,
    std::unordered_map<BasicBlock*, BasicBlock*>* unreachable_continues) {
  for (auto block : live_blocks) {
    if (auto merge_id = block->MergeBlockIdIfAny()) {
      BasicBlock* merge_block = GetParentBlock(merge_id);
      if (!live_blocks.count(merge_block)) {
        unreachable_merges->insert(merge_block);
      }
      if (auto cont_id = block->ContinueBlockIdIfAny()) {
        BasicBlock* cont_block = GetParentBlock(cont_id);
        if (!live_blocks.count(cont_block)) {
          (*unreachable_continues)[cont_block] = block;
        }
      }
    }
  }
}